

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int dupedExprNodeSize(Expr *p,int flags)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = 0x48;
  if ((((flags != 0) && (p->op != 0xa6)) && ((p->flags & 0x1000000) == 0)) &&
     (iVar2 = 0x2c, p->pLeft == (Expr *)0x0)) {
    iVar2 = 0x2c;
    if ((p->x).pList == (ExprList *)0x0) {
      iVar2 = 0x10;
    }
  }
  if (((p->flags & 0x400) == 0) && ((p->u).zToken != (char *)0x0)) {
    sVar1 = strlen((p->u).zToken);
    iVar2 = iVar2 + ((uint)sVar1 & 0x3fffffff) + 1;
  }
  return iVar2 + 7U & 0xfffffff8;
}

Assistant:

static int dupedExprNodeSize(Expr *p, int flags){
  int nByte = dupedExprStructSize(p, flags) & 0xfff;
  if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
    nByte += sqlite3Strlen30NN(p->u.zToken)+1;
  }
  return ROUND8(nByte);
}